

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

uint * kj::_::HeapArrayDisposer::allocate<unsigned_int>(size_t count)

{
  uint *puVar1;
  size_t count_local;
  
  puVar1 = (uint *)allocateImpl(4,count,count,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
  ;
  return puVar1;
}

Assistant:

T* HeapArrayDisposer::allocate(size_t count) {
  if constexpr (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(sizeof(T), count, count, nullptr, nullptr));
  } else if (KJ_HAS_NOTHROW_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, nullptr));
  } else {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, &Dispose_<T>::destruct));
  }
}